

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O0

void __thiscall OpenMD::GenericData::GenericData(GenericData *this,string *id)

{
  undefined8 *in_RDI;
  string *in_stack_ffffffffffffffc8;
  GenericData *this_00;
  
  *in_RDI = &PTR__GenericData_00520860;
  this_00 = (GenericData *)(in_RDI + 1);
  std::__cxx11::string::string((string *)this_00);
  setID(this_00,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

GenericData(const std::string& id) { setID(id); }